

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  int iVar5;
  uint value;
  bool bVar6;
  
  pbVar4 = ctxt->cur;
  while( true ) {
    bVar1 = *pbVar4;
    if ((0x20 < (ulong)bVar1) || ((0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
    pbVar4 = pbVar4 + 1;
    ctxt->cur = pbVar4;
  }
  value = 3;
  if (bVar1 == 0x2d) {
    iVar3 = 0;
LAB_001e57e9:
    do {
      iVar5 = iVar3;
      pbVar4 = pbVar4 + 1;
      ctxt->cur = pbVar4;
      bVar2 = *pbVar4;
      if ((ulong)bVar2 < 0x21) {
        iVar3 = iVar5;
        if ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) != 0) goto LAB_001e57e9;
      }
      iVar3 = 1 - iVar5;
    } while (bVar2 == 0x2d);
    value = iVar5 == 1 | 2;
  }
  xmlXPathCompPathExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar4 = ctxt->cur;
    while( true ) {
      bVar2 = *pbVar4;
      if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    }
    if (bVar2 == 0x7c) {
      do {
        iVar3 = ctxt->comp->last;
        xmlXPathCompExprAdd(ctxt,-1,-1,XPATH_OP_NODE,0,0,0,(void *)0x0,(void *)0x0);
        pbVar4 = ctxt->cur;
        if (*pbVar4 != 0) goto LAB_001e5898;
        while (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
LAB_001e5898:
          pbVar4 = pbVar4 + 1;
          ctxt->cur = pbVar4;
        }
        xmlXPathCompPathExpr(ctxt);
        xmlXPathCompExprAdd(ctxt,iVar3,ctxt->comp->last,XPATH_OP_UNION,0,0,0,(void *)0x0,(void *)0x0
                           );
        pbVar4 = ctxt->cur;
        while( true ) {
          bVar2 = *pbVar4;
          if ((0x20 < (ulong)bVar2) || ((0x100002600U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) break;
          ctxt->cur = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
        }
      } while (bVar2 == 0x7c);
      bVar6 = ctxt->error != 0;
    }
    else {
      bVar6 = false;
    }
    if ((bVar1 == 0x2d) && (!bVar6)) {
      xmlXPathCompExprAdd(ctxt,ctxt->comp->last,-1,XPATH_OP_PLUS,value,0,0,(void *)0x0,(void *)0x0);
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompUnaryExpr(xmlXPathParserContextPtr ctxt) {
    int minus = 0;
    int found = 0;

    SKIP_BLANKS;
    while (CUR == '-') {
        minus = 1 - minus;
	found = 1;
	NEXT;
	SKIP_BLANKS;
    }

    xmlXPathCompUnionExpr(ctxt);
    CHECK_ERROR;
    if (found) {
	if (minus)
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 2, 0);
	else
	    PUSH_UNARY_EXPR(XPATH_OP_PLUS, ctxt->comp->last, 3, 0);
    }
}